

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sit.c
# Opt level: O1

void attrcurse(void)

{
  uint uVar1;
  
  uVar1 = mt_random();
  (*(code *)(&DAT_002ce6c8 +
            *(int *)(&DAT_002ce6c8 + (ulong)(uVar1 - (uVar1 / 0xb + (uVar1 / 0xb) * 10)) * 4)))();
  return;
}

Assistant:

void attrcurse(void)
{
	switch(rnd(11)) {
	case 1 : if (HFire_resistance & FROMOUTSIDE) {
			HFire_resistance &= ~FROMOUTSIDE;
			pline("You feel warmer.");
			break;
		}
	case 2 : if (HTeleportation & FROMOUTSIDE) {
			HTeleportation &= ~FROMOUTSIDE;
			pline("You feel less jumpy.");
			break;
		}
	case 3 : if (HPoison_resistance & FROMOUTSIDE) {
			HPoison_resistance &= ~FROMOUTSIDE;
			pline("You feel a little sick!");
			break;
		}
	case 4 : if (HTelepat & FROMOUTSIDE) {
			HTelepat &= ~FROMOUTSIDE;
			if (Blind && !Blind_telepat)
			    see_monsters();	/* Can't sense mons anymore! */
			pline("Your senses fail!");
			break;
		}
	case 5 : if (HCold_resistance & FROMOUTSIDE) {
			HCold_resistance &= ~FROMOUTSIDE;
			pline("You feel cooler.");
			break;
		}
	case 6 : if (HInvis & FROMOUTSIDE) {
			HInvis &= ~FROMOUTSIDE;
			pline("You feel paranoid.");
			break;
		}
	case 7 : if (HSee_invisible & FROMOUTSIDE) {
			HSee_invisible &= ~FROMOUTSIDE;
			pline("You %s!", Hallucination ? "tawt you taw a puttie tat"
						: "thought you saw something");
			break;
		}
	case 8 : if (HFast & FROMOUTSIDE) {
			HFast &= ~FROMOUTSIDE;
			pline("You feel slower.");
			break;
		}
	case 9 : if (HStealth & FROMOUTSIDE) {
			HStealth &= ~FROMOUTSIDE;
			pline("You feel clumsy.");
			break;
		}
	case 10: if (HProtection & FROMOUTSIDE) {
			HProtection &= ~FROMOUTSIDE;
			pline("You feel vulnerable.");
			u.ublessed = 0;
			break;
		}
	case 11: if (HAggravate_monster & FROMOUTSIDE) {
			HAggravate_monster &= ~FROMOUTSIDE;
			pline("You feel less attractive.");
			break;
		}
	default: break;
	}
}